

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O0

bool __thiscall GameBoard::containsAnXorAnO(GameBoard *this,Field *field)

{
  bool bVar1;
  bool local_71;
  QString local_60;
  QString local_38;
  Field *local_20;
  Field *field_local;
  GameBoard *this_local;
  
  local_20 = field;
  field_local = (Field *)this;
  QAbstractButton::text();
  bVar1 = QString::operator==(&local_38,"X");
  local_71 = true;
  if (!bVar1) {
    QAbstractButton::text();
    local_71 = QString::operator==(&local_60,"O");
  }
  this_local._7_1_ = local_71;
  if (!bVar1) {
    QString::~QString(&local_60);
  }
  QString::~QString(&local_38);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GameBoard::containsAnXorAnO(Field *field)
{
    return field->text() == "X" || field->text() == "O";
}